

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SetEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  ulong uVar1;
  bool bVar2;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar3;
  ulong uVar4;
  char *description;
  UnknownFieldSet *this_01;
  Descriptor *expected;
  Metadata MVar5;
  
  MVar5 = Message::GetMetadata(message);
  if (MVar5.reflection == this) {
    expected = this->descriptor_;
    if (field->containing_type_ == expected) {
      if ((byte)field->field_0x1 < 0xc0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"SetEnumValue",CPPTYPE_ENUM);
        }
        bVar2 = FieldDescriptor::legacy_enum_field_treated_as_closed(field);
        if (bVar2) {
          this_00 = FieldDescriptor::enum_type(field);
          pEVar3 = EnumDescriptor::FindValueByNumber(this_00,value);
          if (pEVar3 == (EnumValueDescriptor *)0x0) {
            uVar4 = (ulong)(uint)(this->schema_).metadata_offset_;
            uVar1 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar4);
            if ((uVar1 & 1) == 0) {
              this_01 = internal::InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                                  ((InternalMetadata *)
                                   ((long)&(message->super_MessageLite)._vptr_MessageLite + uVar4));
            }
            else {
              this_01 = (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8);
            }
            UnknownFieldSet::AddVarint(this_01,field->number_,(long)value);
            return;
          }
        }
        SetEnumValueInternal(this,message,field,value);
        return;
      }
      expected = this->descriptor_;
      description = "Field is repeated; the method requires a singular field.";
      goto LAB_0027d9b6;
    }
  }
  else {
    expected = this->descriptor_;
    MVar5 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (expected,MVar5.descriptor,field,"SetEnumValue");
  }
  description = "Field does not match message type.";
LAB_0027d9b6:
  anon_unknown_6::ReportReflectionUsageError(expected,field,"SetEnumValue",description);
}

Assistant:

void Reflection::SetEnumValue(Message* message, const FieldDescriptor* field,
                              int value) const {
  USAGE_MUTABLE_CHECK_ALL(SetEnumValue, SINGULAR, ENUM);
  if (!CreateUnknownEnumValues(field)) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == nullptr) {
      MutableUnknownFields(message)->AddVarint(field->number(), value);
      return;
    }
  }
  SetEnumValueInternal(message, field, value);
}